

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O2

void __thiscall CTPNStmDefault::gen_code(CTPNStmDefault *this,int param_1,int param_2)

{
  ulong ofs;
  CTPNStm *substm;
  CTcGenTarg *pCVar1;
  uint16_t tmp;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  char buf [2];
  
  if (G_cs->cur_switch_ != (CTPNStmSwitch *)0x0) {
    ofs = G_cs->cur_switch_->default_slot_ofs_;
    buf = (char  [2])((short)(int)(G_cs->super_CTcDataStream).ofs_ - (short)ofs);
    CTcDataStream::write_at(&G_cs->super_CTcDataStream,ofs,buf,2);
    pCVar1 = G_cg;
    pCVar1->last_op_ = 0xf2;
    pCVar1->second_last_op_ = 0xf2;
    substm = (this->super_CTPNStmDefaultBase).stm_;
    if (substm != (CTPNStm *)0x0) {
      CTPNStmBase::gen_code_substm((CTPNStmBase *)this,substm);
    }
    return;
  }
  CTcTokenizer::throw_internal_error
            (0x3aa4,CONCAT44(in_register_00000034,param_1),CONCAT44(in_register_00000014,param_2));
}

Assistant:

void CTPNStmDefault::gen_code(int, int)
{
    ulong slot_ofs;
    char buf[VMB_UINT2];
    ulong jump_ofs;

    /* 
     *   we must have an active 'switch' statement -- if we don't, we have
     *   an internal error of some kind, because we should never have
     *   gotten this far 
     */
    if (G_cs->get_switch() == 0)
        G_tok->throw_internal_error(TCERR_GEN_BAD_CASE);

    /* ask the switch where our slot goes */
    slot_ofs = G_cs->get_switch()->get_default_slot();

    /*
     *   Set the jump offset.  This is the offset from our slot entry in
     *   the case table to the current output offset.  
     */
    jump_ofs = G_cs->get_ofs() - slot_ofs;
    oswp2(buf, (int)jump_ofs);

    /* write our slot entry to the case table */
    G_cs->write_at(slot_ofs, buf, VMB_UINT2);

    /* 
     *   because we can jump here (via the case table), we cannot allow
     *   peephole optimizations from past instructions - clear the
     *   peephole 
     */
    G_cg->clear_peephole();

    /* generate our substatement, if we have one */
    if (stm_ != 0)
        gen_code_substm(stm_);
}